

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O0

void __thiscall Assimp::ArmaturePopulate::Execute(ArmaturePopulate *this,aiScene *out)

{
  pointer *this_00;
  bool bVar1;
  Logger *pLVar2;
  basic_formatter *pbVar3;
  reference __p;
  aiNode *paVar4;
  aiNode *armature;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_280;
  aiNode *local_260;
  aiNode *bone_node;
  aiBone *bone;
  pair<aiBone_*,_aiNode_*> kvp;
  iterator __end1;
  iterator __begin1;
  map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  *__range1;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_a8;
  undefined1 local_78 [8];
  map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  bone_stack;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  aiScene *out_local;
  ArmaturePopulate *this_local;
  
  this_00 = &nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::vector
            ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)this_00);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
             &bone_stack._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
  ::map((map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
         *)local_78);
  BuildBoneList(out->mRootNode,out->mRootNode,out,
                (vector<aiBone_*,_std::allocator<aiBone_*>_> *)this_00);
  BuildNodeList(out->mRootNode,
                (vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                &bone_stack._M_t._M_impl.super__Rb_tree_header._M_node_count);
  BuildBoneStack(out->mRootNode,out->mRootNode,out,
                 (vector<aiBone_*,_std::allocator<aiBone_*>_> *)
                 &nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
                  *)local_78,
                 (vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &bone_stack._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pLVar2 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>(&local_220,(char (*) [18])"Bone stack size: ");
  __range1 = (map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
              *)std::
                map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
                ::size((map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
                        *)local_78);
  pbVar3 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_220,(unsigned_long *)&__range1);
  Formatter::basic_formatter::operator_cast_to_string(&local_a8,pbVar3);
  Logger::debug(pLVar2,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_220);
  __end1 = std::
           map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
           ::begin((map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
                    *)local_78);
  kvp.second = (aiNode *)
               std::
               map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
               ::end((map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
                      *)local_78);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&kvp.second);
    if (!bVar1) {
      std::
      map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
      ::~map((map<aiBone_*,_aiNode_*,_std::less<aiBone_*>,_std::allocator<std::pair<aiBone_*const,_aiNode_*>_>_>
              *)local_78);
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &bone_stack._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<aiBone_*,_std::allocator<aiBone_*>_>::~vector
                ((vector<aiBone_*,_std::allocator<aiBone_*>_> *)
                 &nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    __p = std::_Rb_tree_iterator<std::pair<aiBone_*const,_aiNode_*>_>::operator*(&__end1);
    std::pair<aiBone_*,_aiNode_*>::pair<aiBone_*const,_aiNode_*,_true>
              ((pair<aiBone_*,_aiNode_*> *)&bone,__p);
    bone_node = (aiNode *)bone;
    local_260 = (aiNode *)kvp.first;
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[21]>(&local_3f8,(char (*) [21])"active node lookup: ");
    armature = (aiNode *)aiString::C_Str(&bone_node->mName);
    pbVar3 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_3f8,(char **)&armature);
    Formatter::basic_formatter::operator_cast_to_string(&local_280,pbVar3);
    Logger::debug(pLVar2,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_3f8);
    paVar4 = GetArmatureRoot(local_260,
                             (vector<aiBone_*,_std::allocator<aiBone_*>_> *)
                             &nodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
    if (paVar4 == (aiNode *)0x0) break;
    *(aiNode **)&(bone_node->mTransformation).a2 = paVar4;
    if (local_260 == (aiNode *)0x0) {
      __assert_fail("bone_node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                    ,0x60,"virtual void Assimp::ArmaturePopulate::Execute(aiScene *)");
    }
    *(aiNode **)&(bone_node->mTransformation).a4 = local_260;
    std::_Rb_tree_iterator<std::pair<aiBone_*const,_aiNode_*>_>::operator++(&__end1);
  }
  __assert_fail("armature",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                ,0x5a,"virtual void Assimp::ArmaturePopulate::Execute(aiScene *)");
}

Assistant:

void ArmaturePopulate::Execute(aiScene *out) {

  // Now convert all bone positions to the correct mOffsetMatrix
  std::vector<aiBone *> bones;
  std::vector<aiNode *> nodes;
  std::map<aiBone *, aiNode *> bone_stack;
  BuildBoneList(out->mRootNode, out->mRootNode, out, bones);
  BuildNodeList(out->mRootNode, nodes);

  BuildBoneStack(out->mRootNode, out->mRootNode, out, bones, bone_stack, nodes);

  ASSIMP_LOG_DEBUG_F("Bone stack size: ", bone_stack.size());

  for (std::pair<aiBone *, aiNode *> kvp : bone_stack) {
    aiBone *bone = kvp.first;
    aiNode *bone_node = kvp.second;
    ASSIMP_LOG_DEBUG_F("active node lookup: ", bone->mName.C_Str());
    // lcl transform grab - done in generate_nodes :)

    // bone->mOffsetMatrix = bone_node->mTransformation;
    aiNode *armature = GetArmatureRoot(bone_node, bones);

    ai_assert(armature);

    // set up bone armature id
    bone->mArmature = armature;

    // set this bone node to be referenced properly
    ai_assert(bone_node);
    bone->mNode = bone_node;
  }
}